

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O3

void on_close(intptr_t uuid,fio_protocol_s *_ws)

{
  char cVar1;
  _func_uint8_t_intptr_t_fio_protocol_s_ptr *__ptr;
  _func_uint8_t_intptr_t_fio_protocol_s_ptr *p_Var2;
  long lVar3;
  buffer_s buff;
  size_t sVar4;
  subscription_s *s;
  fio_lock_i ret;
  timespec local_28;
  
  if ((code *)_ws[1].rsv != (code *)0x0) {
    (*(code *)_ws[1].rsv)(_ws[1].on_data);
  }
  if (_ws[3].on_close != (_func_void_intptr_t_fio_protocol_s_ptr *)0x0) {
    fiobj_free((FIOBJ)_ws[3].on_close);
  }
  LOCK();
  cVar1 = (char)_ws[2].rsv;
  *(undefined1 *)&_ws[2].rsv = 1;
  UNLOCK();
  local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,cVar1);
  while (cVar1 != '\0') {
    local_28.tv_sec = 0;
    local_28.tv_nsec = 1;
    nanosleep(&local_28,(timespec *)0x0);
    LOCK();
    cVar1 = (char)_ws[2].rsv;
    *(undefined1 *)&_ws[2].rsv = 1;
    UNLOCK();
    local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,cVar1);
  }
  while ((_func_uint8_t_intptr_t_fio_protocol_s_ptr **)_ws[2].on_close != &_ws[2].on_shutdown) {
    __ptr = _ws[2].on_shutdown;
    if ((__ptr == (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0) ||
       (p_Var2 = *(_func_uint8_t_intptr_t_fio_protocol_s_ptr **)(__ptr + 8), p_Var2 == __ptr)) {
      s = (subscription_s *)0x0;
    }
    else {
      lVar3 = *(long *)__ptr;
      s = *(subscription_s **)(__ptr + 0x10);
      *(long *)p_Var2 = lVar3;
      *(_func_uint8_t_intptr_t_fio_protocol_s_ptr **)(lVar3 + 8) = p_Var2;
      free(__ptr);
    }
    fio_unsubscribe(s);
  }
  LOCK();
  sVar4 = _ws[2].rsv;
  *(undefined1 *)&_ws[2].rsv = 0;
  UNLOCK();
  local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,(char)sVar4);
  buff.data = _ws[3].on_data;
  buff.size = (size_t)_ws[3].on_ready;
  free_ws_buffer((ws_s *)_ws,buff);
  free(_ws);
  return;
}

Assistant:

static void on_close(intptr_t uuid, fio_protocol_s *_ws) {
  destroy_ws((ws_s *)_ws);
  (void)uuid;
}